

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectref.cpp
# Opt level: O1

void __thiscall stackjit::ObjectRef::ObjectRef(ObjectRef *this,RawObjectRef objRef)

{
  int iVar1;
  Type *pTVar2;
  size_t sVar3;
  ClassMetadata *this_00;
  
  this->mPtr = objRef + -9;
  pTVar2 = *(Type **)(objRef + -9);
  this->mType = pTVar2;
  iVar1 = (*pTVar2->_vptr_Type[3])();
  if ((char)iVar1 == '\0') {
    this_00 = ClassType::metadata((ClassType *)this->mType);
    sVar3 = ClassMetadata::size(this_00);
  }
  else {
    pTVar2 = ArrayType::elementType((ArrayType *)this->mType);
    sVar3 = TypeSystem::sizeOfType(pTVar2);
    sVar3 = (long)*(int *)(this->mPtr + 9) * sVar3 + 4;
  }
  this->mSize = sVar3;
  return;
}

Assistant:

ObjectRef::ObjectRef(RawObjectRef objRef)
		: mPtr(objRef - stackjit::OBJECT_HEADER_SIZE), mType(*((const Type**)mPtr)) {
		if (type()->isArray()) {
			auto arrayType = static_cast<const ArrayType*>(type());
			auto elementType = arrayType->elementType();
			auto elementSize = TypeSystem::sizeOfType(elementType);
			auto length = *(int*)dataPtr();
			mSize = stackjit::ARRAY_LENGTH_SIZE + (length * elementSize);
		} else {
			mSize = static_cast<const ClassType*>(type())->metadata()->size();
		}
	}